

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_forest.cpp
# Opt level: O3

void run_dataset<mnist>(size_t tree_max_leaf_size,size_t forest_size,size_t forest_max_leaf_size,
                       size_t forest_max_leaves_visited)

{
  size_t sVar1;
  ostream *poVar2;
  vector<pico_tree::neighbor<int,_float>,_std::allocator<pico_tree::neighbor<int,_float>_>_> nns;
  string fn_nns_gt;
  vector<std::array<float,_784UL>,_std::allocator<std::array<float,_784UL>_>_> test;
  vector<std::array<float,_784UL>,_std::allocator<std::array<float,_784UL>_>_> train;
  vector<pico_tree::neighbor<int,_float>,_std::allocator<pico_tree::neighbor<int,_float>_>_>
  local_98;
  string local_78;
  vector<std::array<float,_784UL>,_std::allocator<std::array<float,_784UL>_>_> local_58;
  vector<std::array<float,_784UL>,_std::allocator<std::array<float,_784UL>_>_> local_40;
  
  mnist::read_train();
  mnist::read_test();
  local_98.
  super__Vector_base<pico_tree::neighbor<int,_float>,_std::allocator<pico_tree::neighbor<int,_float>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.
  super__Vector_base<pico_tree::neighbor<int,_float>,_std::allocator<pico_tree::neighbor<int,_float>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.
  super__Vector_base<pico_tree::neighbor<int,_float>,_std::allocator<pico_tree::neighbor<int,_float>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,mnist::dataset_name_abi_cxx11_._M_dataplus._M_p,
             mnist::dataset_name_abi_cxx11_._M_dataplus._M_p +
             mnist::dataset_name_abi_cxx11_._M_string_length);
  std::__cxx11::string::append((char *)&local_78);
  run_kd_tree<std::array<float,784ul>,float>
            (&local_40,&local_58,&local_78,(max_leaf_size_t)tree_max_leaf_size,&local_98);
  sVar1 = run_kd_forest<std::array<float,784ul>,float>
                    (&local_40,&local_58,&local_98,forest_size,forest_max_leaf_size,
                     forest_max_leaves_visited);
  *(undefined8 *)(std::__cxx11::string::compare + *(long *)(std::cout + -0x18)) = 10;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Precision: ",0xb);
  poVar2 = std::ostream::_M_insert<double>
                     ((double)((float)sVar1 /
                              (float)(ulong)((long)local_98.
                                                  super__Vector_base<pico_tree::neighbor<int,_float>,_std::allocator<pico_tree::neighbor<int,_float>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                             (long)local_98.
                                                  super__Vector_base<pico_tree::neighbor<int,_float>,_std::allocator<pico_tree::neighbor<int,_float>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 3)));
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if (local_98.
      super__Vector_base<pico_tree::neighbor<int,_float>,_std::allocator<pico_tree::neighbor<int,_float>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.
                    super__Vector_base<pico_tree::neighbor<int,_float>,_std::allocator<pico_tree::neighbor<int,_float>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_98.
                          super__Vector_base<pico_tree::neighbor<int,_float>,_std::allocator<pico_tree::neighbor<int,_float>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.
                          super__Vector_base<pico_tree::neighbor<int,_float>,_std::allocator<pico_tree::neighbor<int,_float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_58.
      super__Vector_base<std::array<float,_784UL>,_std::allocator<std::array<float,_784UL>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.
                    super__Vector_base<std::array<float,_784UL>,_std::allocator<std::array<float,_784UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.
                          super__Vector_base<std::array<float,_784UL>,_std::allocator<std::array<float,_784UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.
                          super__Vector_base<std::array<float,_784UL>,_std::allocator<std::array<float,_784UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_40.
      super__Vector_base<std::array<float,_784UL>,_std::allocator<std::array<float,_784UL>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40.
                    super__Vector_base<std::array<float,_784UL>,_std::allocator<std::array<float,_784UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_40.
                          super__Vector_base<std::array<float,_784UL>,_std::allocator<std::array<float,_784UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.
                          super__Vector_base<std::array<float,_784UL>,_std::allocator<std::array<float,_784UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void run_dataset(
    std::size_t tree_max_leaf_size,
    std::size_t forest_size,
    std::size_t forest_max_leaf_size,
    std::size_t forest_max_leaves_visited) {
  using Point = typename Dataset_::point_type;
  using scalar_type = typename Point::value_type;

  auto train = Dataset_::read_train();
  auto test = Dataset_::read_test();
  std::vector<pico_tree::neighbor<int, scalar_type>> nns;
  std::string fn_nns_gt = Dataset_::dataset_name + "_nns_gt.bin";

  run_kd_tree(train, test, fn_nns_gt, tree_max_leaf_size, nns);

  std::size_t equal = run_kd_forest(
      train,
      test,
      nns,
      forest_size,
      forest_max_leaf_size,
      forest_max_leaves_visited);

  std::cout << std::setprecision(10);
  std::cout << "Precision: "
            << (static_cast<float>(equal) / static_cast<float>(nns.size()))
            << std::endl;
}